

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_15::BinaryReaderObjdump::EndModule(BinaryReaderObjdump *this)

{
  uint uVar1;
  bool bVar2;
  pointer pFVar3;
  size_type sVar4;
  Reloc *pRVar5;
  reference reloc_00;
  Reloc *reloc;
  size_t i;
  BinaryReaderObjdump *this_local;
  
  if ((((this->super_BinaryReaderObjdumpBase).options_)->section_name == (char *)0x0) ||
     (((this->super_BinaryReaderObjdumpBase).section_found_ & 1U) != 0)) {
    if (((((this->super_BinaryReaderObjdumpBase).options_)->relocs & 1U) == 0) ||
       ((bVar2 = ShouldPrintDetails(this), !bVar2 ||
        (uVar1 = this->next_data_reloc_,
        sVar4 = std::vector<wabt::Reloc,_std::allocator<wabt::Reloc>_>::size
                          (&((this->super_BinaryReaderObjdumpBase).objdump_state_)->data_relocations
                          ), uVar1 == sVar4)))) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    else {
      pFVar3 = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::operator->
                         (&(this->super_BinaryReaderObjdumpBase).err_stream_);
      Stream::Writef(&pFVar3->super_Stream,"Data reloctions outside of segments!:\n");
      for (reloc = (Reloc *)(ulong)this->next_data_reloc_;
          pRVar5 = (Reloc *)std::vector<wabt::Reloc,_std::allocator<wabt::Reloc>_>::size
                                      (&((this->super_BinaryReaderObjdumpBase).objdump_state_)->
                                        data_relocations), reloc < pRVar5;
          reloc = (Reloc *)((long)&reloc->type + 1)) {
        reloc_00 = std::vector<wabt::Reloc,_std::allocator<wabt::Reloc>_>::operator[]
                             (&((this->super_BinaryReaderObjdumpBase).objdump_state_)->
                               data_relocations,(size_type)reloc);
        BinaryReaderObjdumpBase::PrintRelocation
                  (&this->super_BinaryReaderObjdumpBase,reloc_00,reloc_00->offset);
      }
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  else {
    pFVar3 = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::operator->
                       (&(this->super_BinaryReaderObjdumpBase).err_stream_);
    Stream::Writef(&pFVar3->super_Stream,"Section not found: %s\n",
                   ((this->super_BinaryReaderObjdumpBase).options_)->section_name);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::EndModule() {
  if (options_->section_name && !section_found_) {
    err_stream_->Writef("Section not found: %s\n", options_->section_name);
    return Result::Error;
  }

  if (options_->relocs && ShouldPrintDetails()) {
    if (next_data_reloc_ != objdump_state_->data_relocations.size()) {
      err_stream_->Writef("Data reloctions outside of segments!:\n");
      for (size_t i = next_data_reloc_;
           i < objdump_state_->data_relocations.size(); i++) {
        const Reloc& reloc = objdump_state_->data_relocations[i];
        PrintRelocation(reloc, reloc.offset);
      }

      return Result::Error;
    }
  }

  return Result::Ok;
}